

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiheadattention_x86_fma.cpp
# Opt level: O3

int __thiscall
ncnn::MultiHeadAttention_x86_fma::destroy_pipeline(MultiHeadAttention_x86_fma *this,Option *_opt)

{
  Layer *pLVar1;
  Option opt;
  undefined8 local_48;
  Allocator *pAStack_40;
  Allocator *pAStack_38;
  undefined8 uStack_30;
  ulong local_28;
  undefined8 uStack_20;
  undefined8 uStack_18;
  undefined8 uStack_10;
  
  local_48._0_1_ = _opt->lightmode;
  local_48._1_1_ = _opt->use_shader_pack8;
  local_48._2_1_ = _opt->use_subgroup_ops;
  local_48._3_1_ = _opt->use_reserved_0;
  local_48._4_4_ = _opt->num_threads;
  pAStack_40 = _opt->blob_allocator;
  pAStack_38 = _opt->workspace_allocator;
  uStack_30._0_4_ = _opt->openmp_blocktime;
  uStack_30._4_1_ = _opt->use_winograd_convolution;
  uStack_30._5_1_ = _opt->use_sgemm_convolution;
  uStack_30._6_1_ = _opt->use_int8_inference;
  uStack_30._7_1_ = _opt->use_vulkan_compute;
  local_28._0_1_ = _opt->use_bf16_storage;
  local_28._1_1_ = _opt->use_fp16_packed;
  local_28._2_1_ = _opt->use_fp16_storage;
  local_28._3_1_ = _opt->use_fp16_arithmetic;
  local_28._4_1_ = _opt->use_int8_packed;
  local_28._5_1_ = _opt->use_int8_storage;
  local_28._6_1_ = _opt->use_int8_arithmetic;
  local_28._7_1_ = _opt->use_packing_layout;
  uStack_20._0_4_ = _opt->vulkan_device_index;
  uStack_20._4_1_ = _opt->use_reserved_1;
  uStack_20._5_1_ = _opt->use_image_storage;
  uStack_20._6_1_ = _opt->use_tensor_storage;
  uStack_20._7_1_ = _opt->use_reserved_2;
  uStack_18._0_4_ = _opt->flush_denormals;
  uStack_18._4_1_ = _opt->use_local_pool_allocator;
  uStack_18._5_1_ = _opt->use_shader_local_memory;
  uStack_18._6_1_ = _opt->use_cooperative_matrix;
  uStack_18._7_1_ = _opt->use_winograd23_convolution;
  uStack_10._0_1_ = _opt->use_winograd43_convolution;
  uStack_10._1_1_ = _opt->use_winograd63_convolution;
  uStack_10._2_1_ = _opt->use_a53_a55_optimized_kernel;
  uStack_10._3_1_ = _opt->use_fp16_uniform;
  uStack_10._4_1_ = _opt->use_int8_uniform;
  uStack_10._5_1_ = _opt->use_reserved_9;
  uStack_10._6_1_ = _opt->use_reserved_10;
  uStack_10._7_1_ = _opt->use_reserved_11;
  if ((this->super_MultiHeadAttention).int8_scale_term != 0) {
    local_28 = local_28 & 0xffffffffffffff;
  }
  pLVar1 = this->qk_softmax;
  if (pLVar1 != (Layer *)0x0) {
    (*pLVar1->_vptr_Layer[5])(pLVar1,&local_48);
    if (this->qk_softmax != (Layer *)0x0) {
      (*this->qk_softmax->_vptr_Layer[1])();
    }
    this->qk_softmax = (Layer *)0x0;
  }
  pLVar1 = this->q_gemm;
  if (pLVar1 != (Layer *)0x0) {
    (*pLVar1->_vptr_Layer[5])(pLVar1,&local_48);
    if (this->q_gemm != (Layer *)0x0) {
      (*this->q_gemm->_vptr_Layer[1])();
    }
    this->q_gemm = (Layer *)0x0;
  }
  pLVar1 = this->k_gemm;
  if (pLVar1 != (Layer *)0x0) {
    (*pLVar1->_vptr_Layer[5])(pLVar1,&local_48);
    if (this->k_gemm != (Layer *)0x0) {
      (*this->k_gemm->_vptr_Layer[1])();
    }
    this->k_gemm = (Layer *)0x0;
  }
  pLVar1 = this->v_gemm;
  if (pLVar1 != (Layer *)0x0) {
    (*pLVar1->_vptr_Layer[5])(pLVar1,&local_48);
    if (this->v_gemm != (Layer *)0x0) {
      (*this->v_gemm->_vptr_Layer[1])();
    }
    this->v_gemm = (Layer *)0x0;
  }
  pLVar1 = this->o_gemm;
  if (pLVar1 != (Layer *)0x0) {
    (*pLVar1->_vptr_Layer[5])(pLVar1,&local_48);
    if (this->o_gemm != (Layer *)0x0) {
      (*this->o_gemm->_vptr_Layer[1])();
    }
    this->o_gemm = (Layer *)0x0;
  }
  pLVar1 = this->qk_gemm;
  if (pLVar1 != (Layer *)0x0) {
    (*pLVar1->_vptr_Layer[5])(pLVar1,&local_48);
    if (this->qk_gemm != (Layer *)0x0) {
      (*this->qk_gemm->_vptr_Layer[1])();
    }
    this->qk_gemm = (Layer *)0x0;
  }
  pLVar1 = this->qkv_gemm;
  if (pLVar1 != (Layer *)0x0) {
    (*pLVar1->_vptr_Layer[5])(pLVar1,&local_48);
    if (this->qkv_gemm != (Layer *)0x0) {
      (*this->qkv_gemm->_vptr_Layer[1])();
    }
    this->qkv_gemm = (Layer *)0x0;
  }
  return 0;
}

Assistant:

int MultiHeadAttention_x86_fma::destroy_pipeline(const Option& _opt)
{
    Option opt = _opt;
    if (int8_scale_term)
    {
        opt.use_packing_layout = false; // TODO enable packing
    }

    if (qk_softmax)
    {
        qk_softmax->destroy_pipeline(opt);
        delete qk_softmax;
        qk_softmax = 0;
    }

    if (q_gemm)
    {
        q_gemm->destroy_pipeline(opt);
        delete q_gemm;
        q_gemm = 0;
    }

    if (k_gemm)
    {
        k_gemm->destroy_pipeline(opt);
        delete k_gemm;
        k_gemm = 0;
    }

    if (v_gemm)
    {
        v_gemm->destroy_pipeline(opt);
        delete v_gemm;
        v_gemm = 0;
    }

    if (o_gemm)
    {
        o_gemm->destroy_pipeline(opt);
        delete o_gemm;
        o_gemm = 0;
    }

    if (qk_gemm)
    {
        qk_gemm->destroy_pipeline(opt);
        delete qk_gemm;
        qk_gemm = 0;
    }
    if (qkv_gemm)
    {
        qkv_gemm->destroy_pipeline(opt);
        delete qkv_gemm;
        qkv_gemm = 0;
    }

    return 0;
}